

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_xlat.cpp
# Opt level: O1

void P_TranslateTeleportThings(void)

{
  int iVar1;
  bool bVar2;
  PClass *type;
  AActor *this;
  int *piVar3;
  long lVar4;
  bool bVar5;
  TThinkerIterator<AActor> iterator;
  FThinkerIterator local_38;
  
  local_38.m_ParentType._0_4_ = 0x77;
  type = PClass::FindClass((FName *)&local_38);
  FThinkerIterator::FThinkerIterator(&local_38,type,0x80);
  this = (AActor *)FThinkerIterator::Next(&local_38);
  if (this == (AActor *)0x0) {
    bVar5 = false;
  }
  else {
    bVar5 = false;
    do {
      bVar2 = FTagManager::SectorHasTags(&tagManager,this->Sector);
      if (!bVar2) {
        this->tid = 1;
        AActor::AddToHash(this);
        bVar5 = true;
      }
      this = (AActor *)FThinkerIterator::Next(&local_38);
    } while (this != (AActor *)0x0);
  }
  if ((bVar5) && (0 < numlines)) {
    piVar3 = lines->args + 2;
    lVar4 = 0;
    do {
      iVar1 = piVar3[-3];
      if (iVar1 == 0x27) {
LAB_0055e123:
        iVar1 = piVar3[-1];
joined_r0x0055e147:
        if (iVar1 == 0) {
          piVar3[-2] = 1;
        }
      }
      else {
        if (iVar1 == 0x47) {
          iVar1 = *piVar3;
          goto joined_r0x0055e147;
        }
        if (iVar1 == 0x46) goto LAB_0055e123;
      }
      lVar4 = lVar4 + 1;
      piVar3 = piVar3 + 0x26;
    } while (lVar4 < numlines);
  }
  return;
}

Assistant:

void P_TranslateTeleportThings ()
{
	AActor *dest;
	TThinkerIterator<AActor> iterator(NAME_TeleportDest);
	bool foundSomething = false;

	while ( (dest = iterator.Next()) )
	{
		if (!tagManager.SectorHasTags(dest->Sector))
		{
			dest->tid = 1;
			dest->AddToHash ();
			foundSomething = true;
		}
	}

	if (foundSomething)
	{
		for (int i = 0; i < numlines; ++i)
		{
			if (lines[i].special == Teleport)
			{
				if (lines[i].args[1] == 0)
				{
					lines[i].args[0] = 1;
				}
			}
			else if (lines[i].special == Teleport_NoFog)
			{
				if (lines[i].args[2] == 0)
				{
					lines[i].args[0] = 1;
				}
			}
			else if (lines[i].special == Teleport_ZombieChanger)
			{
				if (lines[i].args[1] == 0)
				{
					lines[i].args[0] = 1;
				}
			}
		}
	}
}